

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void __thiscall lest::confirm::~confirm(confirm *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_129;
  string local_128 [32];
  text local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  lest local_c0 [39];
  allocator local_99;
  string local_98 [32];
  text local_78 [39];
  allocator local_51;
  string local_50 [32];
  lest local_30 [32];
  confirm *local_10;
  confirm *this_local;
  
  local_10 = this;
  if (this->failures < 1) {
    bVar1 = env::pass(&this->output);
    if (bVar1) {
      poVar2 = std::operator<<((this->super_action).os,"All ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->selected);
      poVar2 = std::operator<<(poVar2," selected ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"test",&local_e1);
      pluralise(local_c0,(text *)local_e0,this->selected);
      poVar2 = std::operator<<(poVar2,(string *)local_c0);
      poVar2 = std::operator<<(poVar2," ");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"passed.\n",&local_129);
      colourise(local_108);
      std::operator<<(poVar2,(string *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      std::__cxx11::string::~string((string *)local_c0);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
  }
  else {
    poVar2 = (ostream *)std::ostream::operator<<((this->super_action).os,this->failures);
    poVar2 = std::operator<<(poVar2," out of ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->selected);
    poVar2 = std::operator<<(poVar2," selected ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"test",&local_51);
    pluralise(local_30,(text *)local_50,this->selected);
    poVar2 = std::operator<<(poVar2,(string *)local_30);
    poVar2 = std::operator<<(poVar2," ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"failed.\n",&local_99);
    colourise(local_78);
    std::operator<<(poVar2,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string((string *)local_30);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  env::~env(&this->output);
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }